

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

__m128i highbd_get_recon_8x8_sse4_1(__m128i pred,__m128i res0,__m128i res1,int bd)

{
  int iVar1;
  undefined1 auVar5 [16];
  uint uVar6;
  undefined8 in_XMM0_Qa;
  ulong in_XMM0_Qb;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  __m128i alVar10;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  __m128i max_clip_val;
  __m128i min_clip_val;
  __m128i x1;
  __m128i x0;
  int bd_local;
  __m128i res1_local;
  __m128i res0_local;
  __m128i pred_local;
  int iVar2;
  int iVar3;
  int iVar4;
  
  auVar7._8_8_ = in_XMM0_Qb;
  auVar7._0_8_ = in_XMM0_Qa;
  auVar7 = pmovsxwd(auVar7,in_XMM0_Qa);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = in_XMM0_Qb;
  auVar9 = pmovsxwd(auVar8,in_XMM0_Qb);
  uVar6 = (1 << ((byte)pred[0] & 0x1f)) - 1;
  alVar10[0] = (ulong)uVar6;
  local_118 = (int)in_XMM1_Qa;
  uStack_114 = (int)((ulong)in_XMM1_Qa >> 0x20);
  uStack_110 = (int)in_XMM1_Qb;
  uStack_10c = (int)((ulong)in_XMM1_Qb >> 0x20);
  local_128 = auVar7._0_4_;
  uStack_124 = auVar7._4_4_;
  uStack_120 = auVar7._8_4_;
  uStack_11c = auVar7._12_4_;
  local_138 = (int)in_XMM2_Qa;
  uStack_134 = (int)((ulong)in_XMM2_Qa >> 0x20);
  uStack_130 = (int)in_XMM2_Qb;
  uStack_12c = (int)((ulong)in_XMM2_Qb >> 0x20);
  local_148 = auVar9._0_4_;
  uStack_144 = auVar9._4_4_;
  uStack_140 = auVar9._8_4_;
  uStack_13c = auVar9._12_4_;
  iVar1 = (uint)(-1 < local_118 + local_128) * (local_118 + local_128);
  iVar2 = (uint)(-1 < uStack_114 + uStack_124) * (uStack_114 + uStack_124);
  iVar3 = (uint)(-1 < uStack_110 + uStack_120) * (uStack_110 + uStack_120);
  iVar4 = (uint)(-1 < uStack_10c + uStack_11c) * (uStack_10c + uStack_11c);
  local_198 = CONCAT44(((int)uVar6 < iVar2) * uVar6 | (uint)((int)uVar6 >= iVar2) * iVar2,
                       ((int)uVar6 < iVar1) * uVar6 | (uint)((int)uVar6 >= iVar1) * iVar1);
  uStack_190._0_4_ = ((int)uVar6 < iVar3) * uVar6 | (uint)((int)uVar6 >= iVar3) * iVar3;
  uStack_190._4_4_ = ((int)uVar6 < iVar4) * uVar6 | (uint)((int)uVar6 >= iVar4) * iVar4;
  iVar2 = (uint)(-1 < local_138 + local_148) * (local_138 + local_148);
  iVar3 = (uint)(-1 < uStack_134 + uStack_144) * (uStack_134 + uStack_144);
  iVar4 = (uint)(-1 < uStack_130 + uStack_140) * (uStack_130 + uStack_140);
  iVar1 = (uint)(-1 < uStack_12c + uStack_13c) * (uStack_12c + uStack_13c);
  local_1a8 = CONCAT44(((int)uVar6 < iVar3) * uVar6 | (uint)((int)uVar6 >= iVar3) * iVar3,
                       ((int)uVar6 < iVar2) * uVar6 | (uint)((int)uVar6 >= iVar2) * iVar2);
  uStack_1a0._0_4_ = ((int)uVar6 < iVar4) * uVar6 | (uint)((int)uVar6 >= iVar4) * iVar4;
  uStack_1a0._4_4_ = ((int)uVar6 < iVar1) * uVar6 | (uint)((int)uVar6 >= iVar1) * iVar1;
  auVar5._8_8_ = uStack_190;
  auVar5._0_8_ = local_198;
  auVar9._8_8_ = uStack_1a0;
  auVar9._0_8_ = local_1a8;
  packusdw(auVar5,auVar9);
  alVar10[1]._0_4_ = uVar6;
  alVar10[1]._4_4_ = 0;
  return alVar10;
}

Assistant:

static inline __m128i highbd_get_recon_8x8_sse4_1(const __m128i pred,
                                                  __m128i res0, __m128i res1,
                                                  const int bd) {
  __m128i x0 = _mm_cvtepi16_epi32(pred);
  __m128i x1 = _mm_cvtepi16_epi32(_mm_srli_si128(pred, 8));
  __m128i min_clip_val = _mm_setzero_si128();
  __m128i max_clip_val = _mm_set1_epi32((1 << bd) - 1);
  x0 = _mm_add_epi32(res0, x0);
  x1 = _mm_add_epi32(res1, x1);
  x0 = _mm_max_epi32(x0, min_clip_val);
  x0 = _mm_min_epi32(x0, max_clip_val);
  x1 = _mm_max_epi32(x1, min_clip_val);
  x1 = _mm_min_epi32(x1, max_clip_val);
  x0 = _mm_packus_epi32(x0, x1);
  return x0;
}